

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall
perfetto::TracingServiceImpl::MaybeEmitReceivedTriggers
          (TracingServiceImpl *this,TracingSession *tracing_session,
          vector<perfetto::TracePacket,_std::allocator<perfetto::TracePacket>_> *packets)

{
  long lVar1;
  Message *this_00;
  long lVar2;
  pointer pTVar3;
  ulong uVar4;
  HeapBuffered<perfetto::protos::pbzero::TracePacket> packet;
  long *local_158;
  size_t local_150;
  long local_148 [2];
  long *local_138;
  size_t local_130;
  long local_128 [2];
  vector<perfetto::TracePacket,_std::allocator<perfetto::TracePacket>_> *local_118;
  TracingServiceImpl *local_110;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_108;
  HeapBuffered<perfetto::protos::pbzero::TracePacket> local_f0;
  
  uVar4 = tracing_session->num_triggers_emitted_into_trace;
  pTVar3 = (tracing_session->received_triggers).
           super__Vector_base<perfetto::TracingServiceImpl::TracingSession::TriggerInfo,_std::allocator<perfetto::TracingServiceImpl::TracingSession::TriggerInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (uVar4 < (ulong)(((long)(tracing_session->received_triggers).
                             super__Vector_base<perfetto::TracingServiceImpl::TracingSession::TriggerInfo,_std::allocator<perfetto::TracingServiceImpl::TracingSession::TriggerInfo>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar3 >> 4) *
                     -0x3333333333333333)) {
    lVar2 = uVar4 * 0x50;
    local_118 = packets;
    local_110 = this;
    do {
      protozero::HeapBuffered<perfetto::protos::pbzero::TracePacket>::HeapBuffered
                (&local_f0,0x1000,0x1000);
      this_00 = protozero::Message::BeginNestedMessageInternal((Message *)&local_f0.msg_,0x2e);
      local_138 = local_128;
      lVar1 = *(long *)((long)&(pTVar3->trigger_name)._M_dataplus._M_p + lVar2);
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_138,lVar1,
                 *(long *)((long)&(pTVar3->trigger_name)._M_string_length + lVar2) + lVar1);
      protozero::Message::AppendBytes(this_00,1,local_138,local_130);
      if (local_138 != local_128) {
        operator_delete(local_138,local_128[0] + 1);
      }
      local_158 = local_148;
      lVar1 = *(long *)((long)&(pTVar3->producer_name)._M_dataplus._M_p + lVar2);
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_158,lVar1,
                 *(long *)((long)&(pTVar3->producer_name)._M_string_length + lVar2) + lVar1);
      protozero::Message::AppendBytes(this_00,2,local_158,local_150);
      if (local_158 != local_148) {
        operator_delete(local_158,local_148[0] + 1);
      }
      protozero::Message::AppendVarInt<int>(this_00,3,*(int *)((long)&pTVar3->producer_uid + lVar2))
      ;
      protozero::Message::AppendVarInt<unsigned_long>
                ((Message *)&local_f0.msg_,8,*(unsigned_long *)((long)&pTVar3->boot_time_ns + lVar2)
                );
      protozero::Message::AppendVarInt<int>((Message *)&local_f0.msg_,3,local_110->uid_);
      protozero::Message::AppendVarInt<unsigned_int>((Message *)&local_f0.msg_,10,1);
      protozero::Message::Finalize((Message *)&local_f0.msg_);
      protozero::ScatteredHeapBuffer::StitchSlices(&local_108,&local_f0.shb_);
      anon_unknown_4::SerializeAndAppendPacket(local_118,&local_108);
      if (local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_108.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_108.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      tracing_session->num_triggers_emitted_into_trace =
           tracing_session->num_triggers_emitted_into_trace + 1;
      protozero::MessageArena::~MessageArena(&local_f0.msg_.root_arena_);
      protozero::ScatteredStreamWriter::~ScatteredStreamWriter(&local_f0.writer_);
      protozero::ScatteredHeapBuffer::~ScatteredHeapBuffer(&local_f0.shb_);
      uVar4 = uVar4 + 1;
      pTVar3 = (tracing_session->received_triggers).
               super__Vector_base<perfetto::TracingServiceImpl::TracingSession::TriggerInfo,_std::allocator<perfetto::TracingServiceImpl::TracingSession::TriggerInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar2 = lVar2 + 0x50;
    } while (uVar4 < (ulong)(((long)(tracing_session->received_triggers).
                                    super__Vector_base<perfetto::TracingServiceImpl::TracingSession::TriggerInfo,_std::allocator<perfetto::TracingServiceImpl::TracingSession::TriggerInfo>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar3 >> 4)
                            * -0x3333333333333333));
  }
  return;
}

Assistant:

void TracingServiceImpl::MaybeEmitReceivedTriggers(
    TracingSession* tracing_session,
    std::vector<TracePacket>* packets) {
  PERFETTO_DCHECK(tracing_session->num_triggers_emitted_into_trace <=
                  tracing_session->received_triggers.size());
  for (size_t i = tracing_session->num_triggers_emitted_into_trace;
       i < tracing_session->received_triggers.size(); ++i) {
    const auto& info = tracing_session->received_triggers[i];
    protozero::HeapBuffered<protos::pbzero::TracePacket> packet;
    auto* trigger = packet->set_trigger();
    trigger->set_trigger_name(info.trigger_name);
    trigger->set_producer_name(info.producer_name);
    trigger->set_trusted_producer_uid(static_cast<int32_t>(info.producer_uid));

    packet->set_timestamp(info.boot_time_ns);
    packet->set_trusted_uid(static_cast<int32_t>(uid_));
    packet->set_trusted_packet_sequence_id(kServicePacketSequenceID);
    SerializeAndAppendPacket(packets, packet.SerializeAsArray());
    ++tracing_session->num_triggers_emitted_into_trace;
  }
}